

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O1

void __thiscall
Js::JavascriptPromiseCapability::MarkVisitPtrs
          (JavascriptPromiseCapability *this,SnapshotExtractor *extractor)

{
  Var var;
  
  var = (this->promise).ptr;
  if (((var != (Var)0x0) && ((this->resolve).ptr != (void *)0x0)) &&
     ((this->reject).ptr != (void *)0x0)) {
    TTD::SnapshotExtractor::MarkVisitVar(extractor,var);
    TTD::SnapshotExtractor::MarkVisitVar(extractor,(this->resolve).ptr);
    TTD::SnapshotExtractor::MarkVisitVar(extractor,(this->reject).ptr);
    return;
  }
  TTDAbort_unrecoverable_error("Seems odd, I was not expecting this!!!");
}

Assistant:

void JavascriptPromiseCapability::MarkVisitPtrs(TTD::SnapshotExtractor* extractor)
    {
        TTDAssert(this->promise != nullptr && this->resolve != nullptr && this->reject != nullptr, "Seems odd, I was not expecting this!!!");

        extractor->MarkVisitVar(this->promise);

        extractor->MarkVisitVar(this->resolve);
        extractor->MarkVisitVar(this->reject);
    }